

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void AnalyzeClassFunctionElements
               (ExpressionContext *ctx,ExprClassDefinition *classDefinition,SynClassElements *syntax
               )

{
  Lexeme *pLVar1;
  Lexeme *pLVar2;
  IntrusiveList<MatchData> matches;
  IntrusiveList<MatchData> matches_00;
  IntrusiveList<MatchData> matches_01;
  IntrusiveList<SynIdentifier> aliases_00;
  IntrusiveList<SynIdentifier> aliases_01;
  IntrusiveList<SynFunctionArgument> arguments_00;
  IntrusiveList<SynFunctionArgument> arguments_01;
  IntrusiveList<SynBase> expressions_00;
  IntrusiveList<SynBase> expressions_01;
  IntrusiveList<TypeHandle> arguments_02;
  InplaceStr name;
  IntrusiveList<SynTypedef> *pIVar3;
  ExprClassDefinition *pEVar4;
  bool bVar5;
  ExprBase *pEVar6;
  SynTypeSimple *pSVar7;
  SynFunctionDefinition *this;
  TypeFunction *pTVar8;
  ExprFunctionDefinition *pEVar9;
  SynFunctionArgument *this_00;
  SynBlock *pSVar10;
  SynError *pSVar11;
  SynFunctionDefinition *pSVar12;
  SynBase *pSVar13;
  TypeHandle *this_01;
  SynClassStaticIf *local_200;
  SynClassStaticIf *staticIf;
  MatchData *local_1f0;
  TypeFunction *local_1e8;
  TypeHandle *local_1e0;
  TypeFunction *local_1d8;
  TypeFunction *instance_1;
  IntrusiveList<TypeHandle> argTypes;
  SynFunctionDefinition *function_2;
  SynError *error_1;
  SynBlock *block_1;
  IntrusiveList<SynBase> expressions_1;
  SynIdentifier *local_158;
  SynIdentifier *setName;
  IntrusiveList<SynFunctionArgument> arguments_1;
  IntrusiveList<SynIdentifier> aliases_1;
  ExprFunctionDefinition *node;
  MatchData *local_120;
  ExprBase *local_118;
  ExprBase *definition;
  TypeFunction *local_100;
  TypeFunction *instance;
  SynBase *local_f0;
  SynBase *local_e8;
  SynFunctionArgument *local_e0;
  SynFunctionArgument *local_d8;
  SynFunctionDefinition *local_c8;
  SynFunctionDefinition *function_1;
  SynError *error;
  SynBlock *block;
  IntrusiveList<SynBase> expressions;
  IntrusiveList<SynFunctionArgument> arguments;
  IntrusiveList<SynIdentifier> aliases;
  TypeBase *accessorType;
  IntrusiveList<SynIdentifier> local_68;
  SynTypeSimple *local_58;
  SynBase *parentType;
  SynAccessor *accessor;
  MatchData *local_40;
  SynFunctionDefinition *local_38;
  SynFunctionDefinition *function;
  SynClassElements *syntax_local;
  ExprClassDefinition *classDefinition_local;
  ExpressionContext *ctx_local;
  
  function = (SynFunctionDefinition *)syntax;
  syntax_local = (SynClassElements *)classDefinition;
  classDefinition_local = (ExprClassDefinition *)ctx;
  for (local_38 = (syntax->functions).head; pEVar4 = classDefinition_local, pSVar12 = local_38,
      local_38 != (SynFunctionDefinition *)0x0;
      local_38 = getType<SynFunctionDefinition>((local_38->super_SynBase).next)) {
    pIVar3 = &syntax_local->typedefs;
    IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&accessor);
    matches.tail = local_40;
    matches.head = (MatchData *)accessor;
    pEVar6 = AnalyzeFunctionDefinition
                       ((ExpressionContext *)pEVar4,pSVar12,(FunctionData *)0x0,(TypeFunction *)0x0,
                        (TypeBase *)0x0,matches,false,false,true);
    IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&pIVar3->tail,pEVar6);
  }
  for (parentType = &function->name->super_SynBase; parentType != (SynBase *)0x0;
      parentType = &getType<SynAccessor>(parentType->next)->super_SynBase) {
    pSVar7 = ExpressionContext::get<SynTypeSimple>((ExpressionContext *)classDefinition_local);
    pLVar1 = parentType->begin;
    pLVar2 = parentType->end;
    IntrusiveList<SynIdentifier>::IntrusiveList(&local_68);
    pSVar13 = (syntax_local->super_SynBase).next;
    name.begin = (char *)pSVar13->begin;
    name.end = (char *)pSVar13->end;
    SynTypeSimple::SynTypeSimple(pSVar7,pLVar1,pLVar2,local_68,name);
    local_58 = pSVar7;
    aliases.tail = (SynIdentifier *)
                   AnalyzeType((ExpressionContext *)classDefinition_local,
                               (SynBase *)parentType[1]._vptr_SynBase,true,(bool *)0x0);
    if ((parentType[1].begin != (Lexeme *)0x0) &&
       (bVar5 = isType<TypeError>((TypeBase *)aliases.tail), !bVar5)) {
      IntrusiveList<SynIdentifier>::IntrusiveList((IntrusiveList<SynIdentifier> *)&arguments.tail);
      IntrusiveList<SynFunctionArgument>::IntrusiveList
                ((IntrusiveList<SynFunctionArgument> *)&expressions.tail);
      IntrusiveList<SynBase>::IntrusiveList((IntrusiveList<SynBase> *)&block);
      error = (SynError *)getType<SynBlock>((SynBase *)parentType[1].begin);
      if ((SynBlock *)error == (SynBlock *)0x0) {
        function_1 = (SynFunctionDefinition *)getType<SynError>((SynBase *)parentType[1].begin);
        if (function_1 != (SynFunctionDefinition *)0x0) {
          pSVar13 = &ExpressionContext::get<SynError>((ExpressionContext *)classDefinition_local)->
                     super_SynBase;
          SynError::SynError((SynError *)pSVar13,(function_1->super_SynBase).begin,
                             (function_1->super_SynBase).end);
          IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&block,pSVar13);
        }
      }
      else {
        block = (SynBlock *)(((SynBlock *)error)->expressions).head;
        expressions.head = (((SynBlock *)error)->expressions).tail;
      }
      this = ExpressionContext::get<SynFunctionDefinition>
                       ((ExpressionContext *)classDefinition_local);
      local_d8 = arguments.tail;
      local_e8 = expressions.tail;
      local_e0 = arguments.head;
      instance = (TypeFunction *)block;
      local_f0 = expressions.head;
      aliases_00.tail = aliases.head;
      aliases_00.head = (SynIdentifier *)arguments.tail;
      arguments_00.tail = arguments.head;
      arguments_00.head = (SynFunctionArgument *)expressions.tail;
      expressions_00.tail = expressions.head;
      expressions_00.head = &block->super_SynBase;
      SynFunctionDefinition::SynFunctionDefinition
                (this,parentType->begin,parentType->end,false,false,&local_58->super_SynBase,true,
                 (SynBase *)parentType[1]._vptr_SynBase,false,
                 *(SynIdentifier **)&parentType[1].typeID,aliases_00,arguments_00,expressions_00);
      pEVar4 = classDefinition_local;
      pSVar12 = function;
      local_c8 = this;
      IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&definition);
      pTVar8 = ExpressionContext::GetFunctionType
                         ((ExpressionContext *)pEVar4,&pSVar12->super_SynBase,
                          (TypeBase *)aliases.tail,_definition);
      pEVar4 = classDefinition_local;
      pSVar12 = local_c8;
      local_100 = pTVar8;
      IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&node);
      matches_00.tail = local_120;
      matches_00.head = (MatchData *)node;
      local_118 = AnalyzeFunctionDefinition
                            ((ExpressionContext *)pEVar4,pSVar12,(FunctionData *)0x0,pTVar8,
                             (TypeBase *)0x0,matches_00,false,false,false);
      pEVar9 = getType<ExprFunctionDefinition>(local_118);
      if (pEVar9 != (ExprFunctionDefinition *)0x0) {
        aliases.tail = (SynIdentifier *)pEVar9->function->type->returnType;
      }
      IntrusiveList<ExprBase>::push_back
                ((IntrusiveList<ExprBase> *)&(syntax_local->typedefs).tail,local_118);
    }
    if ((parentType[1].end != (Lexeme *)0x0) &&
       (bVar5 = isType<TypeError>((TypeBase *)aliases.tail), !bVar5)) {
      IntrusiveList<SynIdentifier>::IntrusiveList((IntrusiveList<SynIdentifier> *)&arguments_1.tail)
      ;
      IntrusiveList<SynFunctionArgument>::IntrusiveList
                ((IntrusiveList<SynFunctionArgument> *)&setName);
      local_158 = (SynIdentifier *)parentType[1].pos.begin;
      if (local_158 == (SynIdentifier *)0x0) {
        local_158 = ExpressionContext::get<SynIdentifier>
                              ((ExpressionContext *)classDefinition_local);
        InplaceStr::InplaceStr((InplaceStr *)&expressions_1.tail,"r");
        SynIdentifier::SynIdentifier(local_158,stack0xfffffffffffffe98);
      }
      this_00 = ExpressionContext::get<SynFunctionArgument>
                          ((ExpressionContext *)classDefinition_local);
      SynFunctionArgument::SynFunctionArgument
                (this_00,parentType->begin,parentType->end,false,
                 (SynBase *)parentType[1]._vptr_SynBase,local_158,(SynBase *)0x0);
      IntrusiveList<SynFunctionArgument>::push_back
                ((IntrusiveList<SynFunctionArgument> *)&setName,this_00);
      IntrusiveList<SynBase>::IntrusiveList((IntrusiveList<SynBase> *)&block_1);
      pSVar10 = getType<SynBlock>((SynBase *)parentType[1].end);
      if (pSVar10 == (SynBlock *)0x0) {
        pSVar11 = getType<SynError>((SynBase *)parentType[1].end);
        if (pSVar11 != (SynError *)0x0) {
          pSVar13 = &ExpressionContext::get<SynError>((ExpressionContext *)classDefinition_local)->
                     super_SynBase;
          SynError::SynError((SynError *)pSVar13,(pSVar11->super_SynBase).begin,
                             (pSVar11->super_SynBase).end);
          IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&block_1,pSVar13);
        }
      }
      else {
        block_1 = (SynBlock *)(pSVar10->expressions).head;
        expressions_1.head = (pSVar10->expressions).tail;
      }
      pSVar12 = ExpressionContext::get<SynFunctionDefinition>
                          ((ExpressionContext *)classDefinition_local);
      pSVar7 = local_58;
      pLVar1 = parentType->begin;
      pLVar2 = parentType->end;
      pSVar13 = &ExpressionContext::get<SynTypeAuto>((ExpressionContext *)classDefinition_local)->
                 super_SynBase;
      SynTypeAuto::SynTypeAuto((SynTypeAuto *)pSVar13,parentType->begin,parentType->end);
      argTypes.tail = (TypeHandle *)block_1;
      aliases_01.tail = aliases_1.head;
      aliases_01.head = (SynIdentifier *)arguments_1.tail;
      arguments_01.tail = arguments_1.head;
      arguments_01.head = (SynFunctionArgument *)setName;
      expressions_01.tail = expressions_1.head;
      expressions_01.head = &block_1->super_SynBase;
      SynFunctionDefinition::SynFunctionDefinition
                (pSVar12,pLVar1,pLVar2,false,false,&pSVar7->super_SynBase,true,pSVar13,false,
                 *(SynIdentifier **)&parentType[1].typeID,aliases_01,arguments_01,expressions_01);
      IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&instance_1);
      this_01 = ExpressionContext::get<TypeHandle>((ExpressionContext *)classDefinition_local);
      TypeHandle::TypeHandle(this_01,(TypeBase *)aliases.tail);
      IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&instance_1,this_01);
      local_1e8 = instance_1;
      local_1e0 = argTypes.head;
      arguments_02.tail = argTypes.head;
      arguments_02.head = (TypeHandle *)instance_1;
      pTVar8 = ExpressionContext::GetFunctionType
                         ((ExpressionContext *)classDefinition_local,&function->super_SynBase,
                          (TypeBase *)classDefinition_local[0x191].aliases.tail,arguments_02);
      pEVar4 = classDefinition_local;
      pIVar3 = &syntax_local->typedefs;
      local_1d8 = pTVar8;
      IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&staticIf);
      matches_01.tail = local_1f0;
      matches_01.head = (MatchData *)staticIf;
      pEVar6 = AnalyzeFunctionDefinition
                         ((ExpressionContext *)pEVar4,pSVar12,(FunctionData *)0x0,pTVar8,
                          (TypeBase *)0x0,matches_01,false,false,false);
      IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&pIVar3->tail,pEVar6);
    }
  }
  for (local_200 = (SynClassStaticIf *)(function->expressions).tail;
      local_200 != (SynClassStaticIf *)0x0;
      local_200 = getType<SynClassStaticIf>((local_200->super_SynBase).next)) {
    AnalyzeClassStaticIf
              ((ExpressionContext *)classDefinition_local,(ExprClassDefinition *)syntax_local,
               local_200,false);
  }
  return;
}

Assistant:

void AnalyzeClassFunctionElements(ExpressionContext &ctx, ExprClassDefinition *classDefinition, SynClassElements *syntax)
{
	for(SynFunctionDefinition *function = syntax->functions.head; function; function = getType<SynFunctionDefinition>(function->next))
		classDefinition->functions.push_back(AnalyzeFunctionDefinition(ctx, function, NULL, NULL, NULL, IntrusiveList<MatchData>(), false, false, true));

	for(SynAccessor *accessor = syntax->accessors.head; accessor; accessor = getType<SynAccessor>(accessor->next))
	{
		SynBase *parentType = new (ctx.get<SynTypeSimple>()) SynTypeSimple(accessor->begin, accessor->end, IntrusiveList<SynIdentifier>(), classDefinition->classType->name);

		TypeBase *accessorType = AnalyzeType(ctx, accessor->type);

		if(accessor->getBlock && !isType<TypeError>(accessorType))
		{
			IntrusiveList<SynIdentifier> aliases;
			IntrusiveList<SynFunctionArgument> arguments;

			IntrusiveList<SynBase> expressions;

			if(SynBlock *block = getType<SynBlock>(accessor->getBlock))
				expressions = block->expressions;
			else if(SynError *error = getType<SynError>(accessor->getBlock))
				expressions.push_back(new (ctx.get<SynError>()) SynError(error->begin, error->end));

			SynFunctionDefinition *function = new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(accessor->begin, accessor->end, false, false, parentType, true, accessor->type, false, accessor->name, aliases, arguments, expressions);

			TypeFunction *instance = ctx.GetFunctionType(syntax, accessorType, IntrusiveList<TypeHandle>());

			ExprBase *definition = AnalyzeFunctionDefinition(ctx, function, NULL, instance, NULL, IntrusiveList<MatchData>(), false, false, false);

			if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(definition))
				accessorType = node->function->type->returnType;

			classDefinition->functions.push_back(definition);
		}

		if(accessor->setBlock && !isType<TypeError>(accessorType))
		{
			IntrusiveList<SynIdentifier> aliases;

			IntrusiveList<SynFunctionArgument> arguments;

			SynIdentifier *setName = accessor->setName;

			if(!setName)
				setName = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("r"));

			arguments.push_back(new (ctx.get<SynFunctionArgument>()) SynFunctionArgument(accessor->begin, accessor->end, false, accessor->type, setName, NULL));

			IntrusiveList<SynBase> expressions;

			if(SynBlock *block = getType<SynBlock>(accessor->setBlock))
				expressions = block->expressions;
			else if(SynError *error = getType<SynError>(accessor->setBlock))
				expressions.push_back(new (ctx.get<SynError>()) SynError(error->begin, error->end));

			SynFunctionDefinition *function = new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(accessor->begin, accessor->end, false, false, parentType, true, new (ctx.get<SynTypeAuto>()) SynTypeAuto(accessor->begin, accessor->end), false, accessor->name, aliases, arguments, expressions);

			IntrusiveList<TypeHandle> argTypes;
			argTypes.push_back(new (ctx.get<TypeHandle>()) TypeHandle(accessorType));

			TypeFunction *instance = ctx.GetFunctionType(syntax, ctx.typeAuto, argTypes);

			classDefinition->functions.push_back(AnalyzeFunctionDefinition(ctx, function, NULL, instance, NULL, IntrusiveList<MatchData>(), false, false, false));
		}
	}

	for(SynClassStaticIf *staticIf = syntax->staticIfs.head; staticIf; staticIf = getType<SynClassStaticIf>(staticIf->next))
		AnalyzeClassStaticIf(ctx, classDefinition, staticIf, false);
}